

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_0::FakeFileReader::~FakeFileReader(FakeFileReader *this)

{
  Directory *pDVar1;
  Disposer *pDVar2;
  String *pSVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pDVar1 = (this->current).ptr;
  if (pDVar1 != (Directory *)0x0) {
    (this->current).ptr = (Directory *)0x0;
    pDVar2 = (this->current).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[-2] +
                      (long)&(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode);
  }
  pSVar3 = (this->cwd).parts.ptr;
  if (pSVar3 != (String *)0x0) {
    sVar4 = (this->cwd).parts.size_;
    (this->cwd).parts.ptr = (String *)0x0;
    (this->cwd).parts.size_ = 0;
    pAVar5 = (this->cwd).parts.disposer;
    (**pAVar5->_vptr_ArrayDisposer)
              (pAVar5,pSVar3,0x18,sVar4,sVar4,kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pDVar1 = (this->root).ptr;
  if (pDVar1 != (Directory *)0x0) {
    (this->root).ptr = (Directory *)0x0;
    pDVar2 = (this->root).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[-2] +
                      (long)&(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode);
    return;
  }
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }